

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O3

void uc_init_mipsel(uc_struct_conflict4 *uc)

{
  uc->reg_read_mips = reg_read_mipsel;
  uc->reg_write_mips = reg_write_mipsel;
  uc->reg_reset = reg_reset;
  uc->release = mips_release;
  uc->set_pc = mips_set_pc;
  uc->get_pc = mips_get_pc;
  uc->cpus_init = mips_cpus_init;
  uc->cpu_context_size = 0x2bbc;
  uc->write_mem = cpu_physical_mem_write;
  uc->read_mem = cpu_physical_mem_read;
  uc->tcg_exec_init_mips = tcg_exec_init_mipsel;
  uc->cpu_exec_init_all_mips = cpu_exec_init_all_mipsel;
  uc->vm_start_mips = vm_start_mipsel;
  uc->memory_map_mips = memory_map_mipsel;
  uc->memory_map_ptr_mips = memory_map_ptr_mipsel;
  uc->memory_unmap_mips = memory_unmap_mipsel;
  uc->memory_moveout_mips = memory_moveout_mipsel;
  uc->memory_movein_mips = memory_movein_mipsel;
  uc->readonly_mem = memory_region_set_readonly_mipsel;
  uc->target_page = target_page_init;
  uc->softfloat_initialize = softfloat_init_mipsel;
  uc->tcg_flush_tlb = tcg_flush_softmmu_tlb_mipsel;
  uc->memory_map_io_mips = memory_map_io_mipsel;
  uc->set_tlb = uc_set_tlb;
  uc->memory_mapping = find_memory_mapping_mipsel;
  uc->memory_filter_subregions = memory_region_filter_subregions_mipsel;
  uc->memory_cow_mips = memory_cow_mipsel;
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->release = mips_release;
    uc->set_pc = mips_set_pc;
    uc->get_pc = mips_get_pc;
    uc->cpus_init = mips_cpus_init;
    uc->cpu_context_size = offsetof(CPUMIPSState, end_reset_fields);
    uc_common_init(uc);
}